

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TeamCityReporter::printSectionHeader(TeamCityReporter *this,ostream *os)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  ostream *poVar4;
  reference pvVar5;
  ostream *in_RSI;
  long in_RDI;
  SourceLineInfo lineInfo;
  const_iterator itEnd;
  const_iterator it;
  SourceLineInfo *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  lineOfChars value;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  *in_stack_ffffffffffffff88;
  lineOfChars local_59;
  char *local_58;
  size_t local_50;
  lineOfChars local_41;
  SectionInfo *local_40;
  SectionInfo *local_30;
  SectionInfo *local_28;
  __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                     (in_RDI + 0x78));
  poVar3 = in_stack_ffffffffffffff80;
  if (1 < sVar2) {
    lineOfChars::lineOfChars((lineOfChars *)&stack0xffffffffffffffef,'-');
    poVar3 = Catch::operator<<((ostream *)in_stack_ffffffffffffff78,
                               (lineOfChars)(char)((ulong)in_stack_ffffffffffffff80 >> 0x38));
    std::operator<<(poVar3,'\n');
    local_30 = (SectionInfo *)
               std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
                         ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                          in_stack_ffffffffffffff78);
    local_28 = (SectionInfo *)
               __gnu_cxx::
               __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
               ::operator+(in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
    __gnu_cxx::
    __normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
    ::__normal_iterator<Catch::SectionInfo*>
              ((__normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                *)in_stack_ffffffffffffff80,
               (__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                *)in_stack_ffffffffffffff78);
    local_40 = (SectionInfo *)
               std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
                         ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                          in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<Catch::SectionInfo_const*,std::vector<Catch::SectionInfo,std::allocator<Catch::SectionInfo>>>
    ::__normal_iterator<Catch::SectionInfo*>
              ((__normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                *)in_stack_ffffffffffffff80,
               (__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                *)in_stack_ffffffffffffff78);
    poVar3 = in_RSI;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)in_stack_ffffffffffffff80,
                         (__normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)in_stack_ffffffffffffff78);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator->((__normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                    *)&stack0xffffffffffffffe0);
      anon_unknown_26::printHeaderString
                (poVar3,in_stack_ffffffffffffffe8,(size_t)in_stack_ffffffffffffffe0._M_current);
      __gnu_cxx::
      __normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++((__normal_iterator<const_Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                    *)&stack0xffffffffffffffe0);
    }
    in_RSI = poVar3;
    lineOfChars::lineOfChars(&local_41,'-');
    poVar4 = Catch::operator<<((ostream *)in_stack_ffffffffffffff78,
                               (lineOfChars)(char)((ulong)poVar3 >> 0x38));
    std::operator<<(poVar4,'\n');
  }
  pvVar5 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::front
                     ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)poVar3);
  local_58 = (pvVar5->lineInfo).file;
  local_50 = (pvVar5->lineInfo).line;
  poVar4 = Catch::operator<<(poVar3,in_stack_ffffffffffffff78);
  value.c = (char)((ulong)poVar3 >> 0x38);
  std::operator<<(poVar4,'\n');
  lineOfChars::lineOfChars(&local_59,'.');
  poVar3 = Catch::operator<<(in_RSI,value);
  std::operator<<(poVar3,"\n\n");
  return;
}

Assistant:

void TeamCityReporter::printSectionHeader(std::ostream& os) {
        assert(!m_sectionStack.empty());

        if (m_sectionStack.size() > 1) {
            os << lineOfChars('-') << '\n';

            std::vector<SectionInfo>::const_iterator
                it = m_sectionStack.begin() + 1, // Skip first section (test case)
                itEnd = m_sectionStack.end();
            for (; it != itEnd; ++it)
                printHeaderString(os, it->name);
            os << lineOfChars('-') << '\n';
        }

        SourceLineInfo lineInfo = m_sectionStack.front().lineInfo;

        os << lineInfo << '\n';
        os << lineOfChars('.') << "\n\n";
    }